

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O3

void nrg::InstantExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>
               (Queue *queue,
               _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,int *param,char (*param_4) [7])

{
  int iVar1;
  undefined4 uVar2;
  _Any_data _Stack_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  iVar1 = *param;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(_func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
   local_48._M_unused._0_8_ = fn;
  *(int *)((long)local_48._M_unused._0_8_ + 8) = iVar1;
  uVar2 = *(undefined4 *)(*param_4 + 3);
  *(undefined4 *)((long)local_48._M_unused._0_8_ + 0xc) = *(undefined4 *)*param_4;
  *(undefined4 *)((long)local_48._M_unused._0_8_ + 0xf) = uVar2;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/InstantExecution.h:51:29)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/InstantExecution.h:51:29)>
             ::_M_manager;
  std::function<void_()>::function((function<void_()> *)&_Stack_68,(function<void_()> *)&local_48);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,
             (function<void_()> *)&_Stack_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }